

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::AddMinOrMaxEnumValue
          (SwiftGenerator *this,string *str,string *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string current_value;
  string *type_local;
  string *str_local;
  SwiftGenerator *this_local;
  
  current_value.field_2._8_8_ = type;
  std::__cxx11::string::string((string *)local_40,(string *)str);
  CodeWriter::SetValue(&this->code_,(string *)current_value.field_2._8_8_,(string *)local_40);
  std::operator+(&local_d0,"{{ACCESS_TYPE}} static var ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 current_value.field_2._8_8_);
  std::operator+(&local_b0,&local_d0,": {{ENUM_NAME}} { return .{{");
  std::operator+(&local_90,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 current_value.field_2._8_8_);
  std::operator+(&local_70,&local_90,"}} }");
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void AddMinOrMaxEnumValue(const std::string &str, const std::string &type) {
    const auto current_value = str;
    code_.SetValue(type, current_value);
    code_ += "{{ACCESS_TYPE}} static var " + type +
             ": {{ENUM_NAME}} { return .{{" + type + "}} }";
  }